

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimSnapshotManager.cpp
# Opt level: O2

bool __thiscall OpenMD::SimSnapshotManager::advance(SimSnapshotManager *this)

{
  Snapshot *this_00;
  int iVar1;
  
  Snapshot::operator=((this->super_SnapshotManager).previousSnapshot_,
                      (this->super_SnapshotManager).currentSnapshot_);
  this_00 = (this->super_SnapshotManager).currentSnapshot_;
  iVar1 = Snapshot::getID(this_00);
  Snapshot::setID(this_00,iVar1 + 1);
  Snapshot::clearDerivedProperties((this->super_SnapshotManager).currentSnapshot_);
  return true;
}

Assistant:

bool SimSnapshotManager::advance() {
    *previousSnapshot_ = *currentSnapshot_;
    currentSnapshot_->setID(currentSnapshot_->getID() + 1);
    currentSnapshot_->clearDerivedProperties();
    return true;
  }